

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

char * readMacroArg(char name)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  LexerState *pLVar5;
  uint uVar6;
  uint32_t i;
  int iVar7;
  char *pcVar8;
  Symbol *sym;
  ulong uVar9;
  undefined7 in_register_00000039;
  char local_138 [264];
  
  pLVar5 = lexerState;
  iVar7 = (int)CONCAT71(in_register_00000039,name);
  uVar9 = CONCAT71(in_register_00000039,name) & 0xffffffff;
  if (iVar7 < 0x3c) {
    if (iVar7 == 0x23) {
      pcVar8 = macro_GetAllArgs();
    }
    else {
      if (iVar7 == 0x30) {
        error("Invalid macro argument \'\\0\'\n");
        return (char *)0x0;
      }
LAB_0010ebef:
      if (8 < (byte)(name - 0x31U)) {
        __assert_fail("name > \'0\' && name <= \'9\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                      ,0x314,"readMacroArg");
      }
      pcVar8 = macro_GetArg(iVar7 - 0x30);
    }
  }
  else {
    if (iVar7 == 0x3c) {
      bVar1 = lexerState->disableMacroArgs;
      bVar2 = lexerState->disableInterpolation;
      lexerState->disableMacroArgs = false;
      pLVar5->disableInterpolation = false;
      uVar6 = peek();
      if (uVar6 - 0x30 < 10) {
        bVar3 = false;
        i = readNumber(10,0);
LAB_0010ec6b:
        bVar4 = false;
      }
      else {
        if (((0x19 < (uVar6 & 0xffffffdf) - 0x41) && (uVar6 != 0x5f)) && (uVar6 != 0x2e)) {
          bVar3 = true;
          i = 0;
          goto LAB_0010ec6b;
        }
        uVar9 = 0;
        while (((((uVar6 & 0xffffffdf) - 0x41 < 0x1a || (uVar6 == 0x2e)) ||
                ((uVar6 == 0x5f || ((uVar6 - 0x30 < 10 || (uVar6 == 0x40)))))) || (uVar6 == 0x23)))
        {
          if (uVar9 < 0x100) {
            local_138[uVar9] = (char)uVar6;
            uVar9 = uVar9 + 1;
          }
          shiftChar();
          uVar6 = peek();
        }
        if (uVar9 == 0x100) {
          warning(WARNING_LONG_STR,"Bracketed symbol name too long\n");
          uVar9 = 0xff;
        }
        local_138[uVar9] = '\0';
        sym = sym_FindScopedValidSymbol(local_138);
        if (sym == (Symbol *)0x0) {
          pcVar8 = "Bracketed symbol \"%s\" does not exist\n";
LAB_0010ed2e:
          i = 0;
          error(pcVar8,local_138);
          bVar4 = true;
        }
        else {
          if (SYM_VAR < sym->type) {
            pcVar8 = "Bracketed symbol \"%s\" is not numeric\n";
            goto LAB_0010ed2e;
          }
          i = sym_GetConstantSymValue(sym);
          bVar4 = false;
        }
        bVar3 = false;
      }
      iVar7 = peek();
      shiftChar();
      pLVar5 = lexerState;
      if (iVar7 == 0x3e) {
        if (bVar3) {
          pcVar8 = "Empty bracketed macro argument\n";
        }
        else {
          if (i != 0 || bVar4) {
            lexerState->disableMacroArgs = bVar1;
            pLVar5->disableInterpolation = bVar2;
            goto LAB_0010edac;
          }
          pcVar8 = "Invalid bracketed macro argument \'\\<0>\'\n";
        }
        i = 0;
        error(pcVar8);
      }
      else {
        pcVar8 = printChar(iVar7);
        i = 0;
        error("Invalid character in bracketed macro argument %s\n",pcVar8);
      }
LAB_0010edac:
      if (i == 0) {
        return (char *)0x0;
      }
      pcVar8 = macro_GetArg(i);
      if (pcVar8 != (char *)0x0) {
        return pcVar8;
      }
      pcVar8 = "Macro argument \'\\<%u>\' not defined\n";
      uVar9 = (ulong)i;
      goto LAB_0010ec1e;
    }
    if (iVar7 != 0x40) goto LAB_0010ebef;
    pcVar8 = macro_GetUniqueIDStr();
  }
  if (pcVar8 != (char *)0x0) {
    return pcVar8;
  }
  pcVar8 = "Macro argument \'\\%c\' not defined\n";
LAB_0010ec1e:
  error(pcVar8,uVar9);
  return (char *)0x0;
}

Assistant:

static char const *readMacroArg(char name)
{
	char const *str = NULL;

	if (name == '@') {
		str = macro_GetUniqueIDStr();
	} else if (name == '#') {
		str = macro_GetAllArgs();
	} else if (name == '<') {
		uint32_t num = readBracketedMacroArgNum();

		if (num == 0)
			return NULL;
		str = macro_GetArg(num);
		if (!str)
			error("Macro argument '\\<%" PRIu32 ">' not defined\n", num);
		return str;
	} else if (name == '0') {
		error("Invalid macro argument '\\0'\n");
		return NULL;
	} else {
		assert(name > '0' && name <= '9');
		str = macro_GetArg(name - '0');
	}

	if (!str)
		error("Macro argument '\\%c' not defined\n", name);
	return str;
}